

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

Abc_Obj_t * Gia_ManInsertOne_rec(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  
  if (pObj == (Abc_Obj_t *)0x0) {
    pAVar1 = Abc_NtkCreateNodeConst0(pNtk);
    return pAVar1;
  }
  if (pObj->pNtk == pNew) {
    pAVar1 = (Abc_Obj_t *)(pObj->field_6).pTemp;
    if (pAVar1 == (Abc_Obj_t *)0x0) {
      if (0 < (pObj->vFanins).nSize) {
        lVar2 = 0;
        do {
          Gia_ManInsertOne_rec
                    (pNtk,pNew,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]]
                    );
          lVar2 = lVar2 + 1;
        } while (lVar2 < (pObj->vFanins).nSize);
      }
      pAVar1 = Abc_NtkDupObj(pNtk,pObj,0);
      (pObj->field_6).pCopy = pAVar1;
      if (0 < (pObj->vFanins).nSize) {
        lVar2 = 0;
        do {
          Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]]
                         );
          lVar2 = lVar2 + 1;
        } while (lVar2 < (pObj->vFanins).nSize);
        pAVar1 = (Abc_Obj_t *)(pObj->field_6).pTemp;
      }
    }
    return pAVar1;
  }
  __assert_fail("Abc_ObjNtk(pObj) == pNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                ,0x1ed,"Abc_Obj_t *Gia_ManInsertOne_rec(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Gia_ManInsertOne_rec( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;  int i;
    if ( pObj == NULL )
        return Abc_NtkCreateNodeConst0( pNtk );
    assert( Abc_ObjNtk(pObj) == pNew );
    if ( pObj->pCopy )
        return pObj->pCopy;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Gia_ManInsertOne_rec( pNtk, pNew, pFanin );
    pObj->pCopy = Abc_NtkDupObj( pNtk, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj, pFanin );
    return pObj->pCopy;
}